

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O3

string * __thiscall
soul::Type::getShortIdentifierDescription_abi_cxx11_(string *__return_storage_ptr__,Type *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Category CVar2;
  bool bVar3;
  long lVar4;
  char cVar5;
  uint uVar6;
  long *plVar7;
  Structure *pSVar8;
  undefined8 *puVar9;
  size_type *psVar10;
  ulong uVar11;
  unsigned_long uVar12;
  StructurePtr *pSVar13;
  ulong *puVar14;
  char cVar15;
  char *__s;
  _Alloc_hider _Var16;
  undefined8 uVar17;
  ulong __val;
  string local_c8;
  Type local_a8;
  long lStack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  uint local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  string local_68;
  Type local_48;
  
  if (this->isConstant == true) {
    removeConst(&local_a8,this);
    getShortIdentifierDescription_abi_cxx11_(&local_c8,&local_a8);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x258ff6);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar10) {
      lVar4 = plVar7[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    }
    __return_storage_ptr__->_M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    RefCountedPtr<soul::Structure>::decIfNotNull(local_a8.structure.object);
    return __return_storage_ptr__;
  }
  if (this->isRef == true) {
    removeReference(&local_a8,this);
    getShortIdentifierDescription_abi_cxx11_(&local_c8,&local_a8);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x258ffd);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar10) {
      lVar4 = plVar7[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    }
    __return_storage_ptr__->_M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    RefCountedPtr<soul::Structure>::decIfNotNull(local_a8.structure.object);
    return __return_storage_ptr__;
  }
  CVar2 = this->category;
  if (CVar2 == vector) {
    __val = (ulong)this->boundingSize;
    cVar15 = '\x01';
    if (9 < __val) {
      uVar11 = __val;
      cVar5 = '\x04';
      do {
        cVar15 = cVar5;
        if (uVar11 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_001a866c;
        }
        if (uVar11 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_001a866c;
        }
        if (uVar11 < 10000) goto LAB_001a866c;
        bVar3 = 99999 < uVar11;
        uVar11 = uVar11 / 10000;
        cVar5 = cVar15 + '\x04';
      } while (bVar3);
      cVar15 = cVar15 + '\x01';
    }
LAB_001a866c:
    local_88 = &local_78;
    std::__cxx11::string::_M_construct((ulong)&local_88,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_88->_M_local_buf,local_80,__val);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x259002);
    pSVar13 = (StructurePtr *)(plVar7 + 2);
    if ((StructurePtr *)*plVar7 == pSVar13) {
      local_a8.structure.object = pSVar13->object;
      lStack_90 = plVar7[3];
      local_a8._0_8_ = &local_a8.structure;
    }
    else {
      local_a8.structure.object = pSVar13->object;
      local_a8._0_8_ = (StructurePtr *)*plVar7;
    }
    local_a8._8_8_ = plVar7[1];
    *plVar7 = (long)pSVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
    puVar14 = (ulong *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar14) {
      local_c8.field_2._M_allocated_capacity = *puVar14;
      local_c8.field_2._8_8_ = plVar7[3];
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *puVar14;
      local_c8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_c8._M_string_length = plVar7[1];
    *plVar7 = (long)puVar14;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_c8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar10) {
      lVar4 = plVar7[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    }
    __return_storage_ptr__->_M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((StructurePtr *)local_a8._0_8_ != &local_a8.structure) {
LAB_001a87d2:
      operator_delete((void *)local_a8._0_8_,
                      (ulong)((long)&((local_a8.structure.object)->super_RefCountedObject).refCount
                             + 1));
    }
LAB_001a87df:
    _Var16._M_p = (pointer)local_88;
    if (local_88 == &local_78) {
      return __return_storage_ptr__;
    }
    goto LAB_001a87ee;
  }
  uVar6 = this->boundingSize;
  if (CVar2 == array && uVar6 == 0) {
    getArrayElementType(&local_a8,this);
    getShortIdentifierDescription_abi_cxx11_(&local_c8,&local_a8);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x259007);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar10) {
      lVar4 = plVar7[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    }
    __return_storage_ptr__->_M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    RefCountedPtr<soul::Structure>::decIfNotNull(local_a8.structure.object);
    return __return_storage_ptr__;
  }
  if (CVar2 == array) {
    cVar15 = '\x01';
    if (9 < uVar6) {
      uVar12 = (long)(int)uVar6;
      cVar5 = '\x04';
      do {
        cVar15 = cVar5;
        if (uVar12 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_001a88a7;
        }
        if (uVar12 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_001a88a7;
        }
        if (uVar12 < 10000) goto LAB_001a88a7;
        bVar3 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        cVar5 = cVar15 + '\x04';
      } while (bVar3);
      cVar15 = cVar15 + '\x01';
    }
LAB_001a88a7:
    local_88 = &local_78;
    std::__cxx11::string::_M_construct((ulong)&local_88,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_88->_M_local_buf,local_80,(long)(int)uVar6);
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x25900e);
    pSVar13 = (StructurePtr *)(puVar9 + 2);
    if ((StructurePtr *)*puVar9 == pSVar13) {
      local_a8.structure.object = pSVar13->object;
      lStack_90 = puVar9[3];
      local_a8._0_8_ = &local_a8.structure;
    }
    else {
      local_a8.structure.object = pSVar13->object;
      local_a8._0_8_ = (StructurePtr *)*puVar9;
    }
    local_a8._8_8_ = puVar9[1];
    *puVar9 = pSVar13;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
    paVar1 = &local_c8.field_2;
    puVar14 = (ulong *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar14) {
      local_c8.field_2._M_allocated_capacity = *puVar14;
      local_c8.field_2._8_8_ = plVar7[3];
      local_c8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *puVar14;
      local_c8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_c8._M_string_length = plVar7[1];
    *plVar7 = (long)puVar14;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    getArrayElementType(&local_48,this);
    getShortIdentifierDescription_abi_cxx11_(&local_68,&local_48);
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      uVar17 = local_c8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_68._M_string_length + local_c8._M_string_length) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        uVar17 = local_68.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_68._M_string_length + local_c8._M_string_length) goto LAB_001a89ee;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_68,0,(char *)0x0,(ulong)local_c8._M_dataplus._M_p);
    }
    else {
LAB_001a89ee:
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_68._M_dataplus._M_p);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar10 = puVar9 + 2;
    if ((size_type *)*puVar9 == psVar10) {
      uVar17 = puVar9[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar17;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar9;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    }
    __return_storage_ptr__->_M_string_length = puVar9[1];
    *puVar9 = psVar10;
    puVar9[1] = 0;
    *(undefined1 *)psVar10 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    RefCountedPtr<soul::Structure>::decIfNotNull(local_48.structure.object);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((StructurePtr *)local_a8._0_8_ != &local_a8.structure) goto LAB_001a87d2;
    goto LAB_001a87df;
  }
  switch(CVar2) {
  case wrap:
    std::__cxx11::to_string(&local_c8,uVar6);
    std::operator+(__return_storage_ptr__,"wrap_",&local_c8);
    goto LAB_001a8867;
  case clamp:
    std::__cxx11::to_string(&local_c8,uVar6);
    std::operator+(__return_storage_ptr__,"clamp_",&local_c8);
LAB_001a8867:
    local_78._M_allocated_capacity = local_c8.field_2._M_allocated_capacity;
    _Var16._M_p = local_c8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
LAB_001a87ee:
      operator_delete(_Var16._M_p,local_78._M_allocated_capacity + 1);
    }
    break;
  case structure:
    pSVar8 = getStructRef(this);
    std::operator+(__return_storage_ptr__,"struct_",&pSVar8->name);
    break;
  case stringLiteral:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"string","");
    break;
  default:
    uVar6 = (this->primitiveType).type - void_;
    if (uVar6 < 9) {
      __s = *(char **)(&DAT_002ca9c0 + (ulong)uVar6 * 8);
    }
    else {
      __s = "_";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Type::getShortIdentifierDescription() const
{
    if (isConst())          return "const_" + removeConst().getShortIdentifierDescription();
    if (isReference())      return "ref_" + removeReference().getShortIdentifierDescription();
    if (isVector())         return "vec_" + std::to_string (getVectorSize()) + "_" + primitiveType.getShortIdentifierDescription();
    if (isUnsizedArray())   return "slice_" + getArrayElementType().getShortIdentifierDescription();
    if (isArray())          return "arr_" + std::to_string (getArraySize()) + "_" + getArrayElementType().getShortIdentifierDescription();
    if (isWrapped())        return "wrap_" + std::to_string (getBoundedIntLimit());
    if (isClamped())        return "clamp_" + std::to_string (getBoundedIntLimit());
    if (isStruct())         return "struct_" + getStructRef().getName();
    if (isStringLiteral())  return "string";

    return primitiveType.getShortIdentifierDescription();
}